

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O3

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  ON_4fColor OVar7;
  ON_4fColor col;
  ON_4fColor colDark;
  ON_4fColor local_68;
  undefined1 local_58 [16];
  double local_48;
  double local_38;
  double dStack_30;
  ON_4fColor local_28;
  ON_4fColor local_18;
  undefined1 auVar8 [12];
  
  ON_4fColor::ON_4fColor(&local_28,0,0,0x40,0xff);
  if (-3.0 <= altitude) {
    dVar1 = altitude;
    if (altitude <= 0.0) {
      dVar1 = 0.0;
    }
    dVar1 = pow(dVar1,1.5);
    dVar1 = dVar1 * 30.0 + 500.0;
    if (5300.0 <= dVar1) {
      dVar1 = 5300.0;
    }
    dVar2 = pow(2.718281828459045,14388.0 / (dVar1 * 0.6));
    local_38 = 12.86008230452675 / (dVar2 + -1.0);
    local_48 = pow(2.718281828459045,14388.0 / (dVar1 * 0.56));
    dVar1 = pow(2.718281828459045,14388.0 / (dVar1 * 0.44));
    auVar3._8_4_ = SUB84(dVar1 + -1.0,0);
    auVar3._0_8_ = local_48 + -1.0;
    auVar3._12_4_ = (int)((ulong)(dVar1 + -1.0) >> 0x20);
    auVar3 = divpd(_DAT_006d5cf0,auVar3);
    uVar4 = auVar3._8_4_;
    uVar5 = auVar3._12_4_;
    if (auVar3._8_8_ <= auVar3._0_8_) {
      uVar4 = auVar3._0_4_;
      uVar5 = auVar3._4_4_;
    }
    if ((double)CONCAT44(uVar5,uVar4) <= local_38) {
      uVar4 = SUB84(local_38,0);
      uVar5 = (undefined4)((ulong)local_38 >> 0x20);
    }
    dVar1 = 1.0 / (double)CONCAT44(uVar5,uVar4);
    dVar2 = local_38 * dVar1;
    auVar6._0_8_ = dVar1 * auVar3._0_8_;
    auVar6._8_8_ = dVar1 * auVar3._8_8_;
    local_58 = divpd(auVar6,_DAT_006d5d00);
    local_38 = local_58._8_8_;
    dVar1 = local_38;
    if (local_38 <= local_58._0_8_) {
      dVar1 = local_58._0_8_;
    }
    if (dVar1 <= dVar2) {
      dVar1 = dVar2;
    }
    dVar1 = 1.0 / dVar1;
    dStack_30 = local_38;
    dVar2 = pow(dVar2 * dVar1,0.15);
    local_48 = (double)CONCAT44(local_48._4_4_,(float)dVar2);
    dVar2 = pow((double)local_58._0_8_ * dVar1,0.15);
    local_58._0_4_ = (float)dVar2;
    dVar1 = pow(dVar1 * local_38,0.15);
    ON_4fColor::ON_4fColor(&local_18,local_48._0_4_,(float)local_58._0_4_,(float)dVar1,1.0);
    local_68.m_color[0] = local_18.m_color[0];
    local_68.m_color[1] = local_18.m_color[1];
    local_68.m_color[2] = local_18.m_color[2];
    local_68.m_color[3] = local_18.m_color[3];
    if (altitude < 0.0) {
      ON_4fColor::BlendTo(&local_68,(float)(altitude / -3.0),&local_28,false);
    }
  }
  else {
    local_68.m_color[0] = local_28.m_color[0];
    local_68.m_color[1] = local_28.m_color[1];
    local_68.m_color[2] = local_28.m_color[2];
    local_68.m_color[3] = local_28.m_color[3];
  }
  OVar7.m_color[0] = local_68.m_color[0];
  auVar8._4_4_ = local_68.m_color[1];
  OVar7.m_color[2] = local_68.m_color[2];
  OVar7.m_color[3] = local_68.m_color[3];
  return (ON_4fColor)OVar7.m_color;
}

Assistant:

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude) // Static.
{
  ON_4fColor colDark(0, 0, 64, 255);

  if (altitude < -TwilightZone())
    return colDark;

  const double value = (30.0 * pow(std::max(0.0, altitude), 1.5)) + 500.0;
  auto temperature = std::min(5300.0, value);

  ON_4fColor col = ColorTemperature(temperature);

  if (altitude < 0.0)
  {
    const double dBlend = -altitude / TwilightZone();
    col.BlendTo(float(dBlend), colDark);
  }

  return col;
}